

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O0

cio_bs_state internal_read_until(cio_buffered_stream *buffered_stream)

{
  cio_read_buffer *read_buffer_00;
  uint8_t *haystack_00;
  char *needle_00;
  size_t needlelen;
  size_t haystacklen;
  void *pvVar1;
  ptrdiff_t diff;
  uint8_t *found;
  size_t needle_length;
  char *needle;
  uint8_t *haystack;
  cio_read_buffer *read_buffer;
  cio_buffered_stream *buffered_stream_local;
  
  read_buffer_00 = buffered_stream->read_buffer;
  if (buffered_stream->last_error == CIO_SUCCESS) {
    haystack_00 = read_buffer_00->fetch_ptr;
    needle_00 = (buffered_stream->read_info).until.delim;
    needlelen = (buffered_stream->read_info).until.delim_length;
    haystacklen = cio_read_buffer_unread_bytes(read_buffer_00);
    pvVar1 = cio_memmem(haystack_00,haystacklen,needle_00,needlelen);
    if (pvVar1 == (void *)0x0) {
      buffered_stream_local._4_4_ = CIO_BS_AGAIN;
    }
    else {
      buffered_stream_local._4_4_ =
           call_handler(buffered_stream,CIO_SUCCESS,read_buffer_00,
                        (long)pvVar1 + (needlelen - (long)read_buffer_00->fetch_ptr));
    }
  }
  else {
    buffered_stream_local._4_4_ =
         call_handler(buffered_stream,buffered_stream->last_error,read_buffer_00,0);
  }
  return buffered_stream_local._4_4_;
}

Assistant:

static enum cio_bs_state internal_read_until(struct cio_buffered_stream *buffered_stream)
{
	struct cio_read_buffer *read_buffer = buffered_stream->read_buffer;

	if (cio_unlikely(buffered_stream->last_error != CIO_SUCCESS)) {
		return call_handler(buffered_stream, buffered_stream->last_error, read_buffer, 0);
	}

	const uint8_t *haystack = read_buffer->fetch_ptr;
	const char *needle = buffered_stream->read_info.until.delim;
	size_t needle_length = buffered_stream->read_info.until.delim_length;
	const uint8_t *found = cio_memmem(haystack, cio_read_buffer_unread_bytes(read_buffer), needle, needle_length);
	if (found != NULL) {
		ptrdiff_t diff = (found + needle_length) - read_buffer->fetch_ptr;
		return call_handler(buffered_stream, CIO_SUCCESS, read_buffer, (size_t)diff);
	}

	return CIO_BS_AGAIN;
}